

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Operands.c
# Opt level: O0

void EffAdr(OpConfig *EA,int Bad)

{
  uint uVar1;
  int Bad_local;
  OpConfig *EA_local;
  
  if ((1 << ((char)EA->Mode - 1U & 0x1f) & Bad) == 0) {
    if (EA->Mode < 0xd) {
      if (EA->Mode < 8) {
        uVar1 = (EA->Mode + -1) * 8 | EA->Rn;
      }
      else {
        uVar1 = EA->Mode - 8U | 0x38;
      }
      Op = uVar1 | Op;
      OperExt(EA);
    }
  }
  else {
    Error(EA->Loc,5);
  }
  return;
}

Assistant:

void 
EffAdr (register struct OpConfig *EA, int Bad)
/* Adds effective address field to Op (BITSET representing opcode). */
{
	if ((1 << (EA->Mode - 1)) IN Bad) {
		Error(EA->Loc, ModeErr); /* Invalid mode */
		return;
	} else if (EA->Mode > 12) /* Special modes */
		return;
	else if (EA->Mode < 8) /* Register direct or indirect */
		Op |= ((EA->Mode - 1) << 3) | EA->Rn;
	else
		Op |= 0x0038 | (EA->Mode - 8); /* Absolute modes */
	OperExt(EA);
}